

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * dmrC_evaluate_statement(dmr_C *C,statement *stmt)

{
  char cVar1;
  ident *piVar2;
  statement_list *psVar3;
  long lVar4;
  statement *stmt_00;
  expression *peVar5;
  symbol *psVar6;
  char *pcVar7;
  void *pvVar8;
  allocator *ident;
  position pos;
  int iVar9;
  expression **enumcase;
  expression *local_58;
  undefined1 local_50 [8];
  ptr_list_iter siter__;
  
  if (stmt == (statement *)0x0) {
    return (symbol *)0x0;
  }
  lVar4 = 0;
LAB_0010d8e6:
  psVar6 = (symbol *)0x0;
  if (stmt->type == STMT_LABEL) goto code_r0x0010d8ee;
  siter__._16_8_ = lVar4;
  switch(stmt->type) {
  case STMT_DECLARATION:
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_50,(ptr_list *)(stmt->field_2).field_1.expression);
    while (psVar6 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_50), psVar6 != (symbol *)0x0)
    {
      evaluate_symbol(C,psVar6);
    }
    return (symbol *)0x0;
  case STMT_EXPRESSION:
    psVar6 = dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
    if (psVar6 != (symbol *)0x0) {
      peVar5 = (stmt->field_2).field_1.expression;
      if (peVar5->ctype == &C->S->null_ctype) {
        peVar5 = cast_to(C,peVar5,&C->S->ptr_ctype);
        (stmt->field_2).field_1.expression = peVar5;
      }
      psVar6 = degenerate(C,peVar5);
      if (lVar4 != 0) {
        return (symbol *)0x0;
      }
      return psVar6;
    }
    goto LAB_0010dee1;
  case STMT_COMPOUND:
    evaluate_symbol(C,(stmt->field_2).field_2.ret_target);
    psVar6 = dmrC_evaluate_statement(C,(stmt->field_2).field_4.args);
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_50,(ptr_list *)(stmt->field_2).field_1.expression);
    while (stmt_00 = (statement *)ptrlist_iter_next((ptr_list_iter *)local_50),
          stmt_00 != (statement *)0x0) {
      psVar6 = dmrC_evaluate_statement(C,stmt_00);
    }
    if (psVar6 == (symbol *)0x0) {
      if (lVar4 != 0) {
        return (symbol *)0x0;
      }
      return &C->S->void_ctype;
    }
switchD_0010d90e_caseD_9:
    if (lVar4 != 0) {
      return (symbol *)0x0;
    }
    return psVar6;
  case STMT_IF:
    peVar5 = (stmt->field_2).field_1.expression;
    psVar6 = (symbol *)0x0;
    if (peVar5 != (expression *)0x0) {
      evaluate_conditional(C,peVar5,0);
      dmrC_evaluate_statement(C,(stmt->field_2).field_3.if_true);
      goto LAB_0010d99a;
    }
    goto switchD_0010d90e_caseD_9;
  case STMT_RETURN:
    peVar5 = (stmt->field_2).field_1.expression;
    dmrC_evaluate_expression(C,peVar5);
    psVar6 = (C->current_fn->field_14).field_2.ctype.base_type;
    if ((psVar6 == (symbol *)0x0) || (psVar6 == &C->S->void_ctype)) {
      if (peVar5 != (expression *)0x0) {
        if (peVar5->ctype != &C->S->void_ctype) {
          pcVar7 = "void";
          if (psVar6 == (symbol *)0x0) {
            pcVar7 = "typeless";
          }
          dmrC_expression_error(C,peVar5,"return expression in %s function",pcVar7);
        }
        if (C->Wreturn_void != 0) {
          dmrC_warning(C,stmt->pos,"returning void-valued expression");
          psVar6 = (symbol *)0x0;
          goto switchD_0010d90e_caseD_9;
        }
      }
    }
    else {
      if (peVar5 == (expression *)0x0) {
        pos = stmt->pos;
        pcVar7 = "return with no return value";
        goto LAB_0010de72;
      }
      if (peVar5->ctype != (symbol *)0x0) {
        compatible_assignment_types
                  (C,peVar5,psVar6,(expression **)&(stmt->field_2).field_0,"return expression");
        return (symbol *)0x0;
      }
    }
LAB_0010dee1:
    psVar6 = (symbol *)0x0;
    goto switchD_0010d90e_caseD_9;
  case STMT_CASE:
    dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
    dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
LAB_0010d99a:
    lVar4 = 0x20;
LAB_0010d99f:
    stmt = *(statement **)((long)&stmt->type + lVar4);
    lVar4 = 1;
    if (stmt == (statement *)0x0) {
      return (symbol *)0x0;
    }
    goto LAB_0010d8e6;
  case STMT_SWITCH:
    local_58 = (expression *)0x0;
    peVar5 = (stmt->field_2).field_1.expression;
    dmrC_evaluate_expression(C,peVar5);
    dmrC_evaluate_statement(C,(stmt->field_2).field_3.if_true);
    if (peVar5 == (expression *)0x0) {
      return (symbol *)0x0;
    }
    psVar6 = peVar5->ctype;
    if (psVar6 == (symbol *)0x0) {
      enumcase = &local_58;
    }
    else {
      cVar1 = *(char *)psVar6;
      if (cVar1 == '\x03') {
        cVar1 = **(char **)((long)&psVar6->field_14 + 0x38);
      }
      enumcase = &local_58;
      if (cVar1 == '\t') {
        enumcase = (expression **)0x0;
      }
    }
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_50,
               (ptr_list *)((stmt->field_2).field_10.asm_clobbers)->list_[0xf]);
    while (pvVar8 = ptrlist_iter_next((ptr_list_iter *)local_50), pvVar8 != (void *)0x0) {
      lVar4 = *(long *)((long)pvVar8 + 0x90);
      check_case_type(C,peVar5,*(expression **)(lVar4 + 0x10),enumcase);
      check_case_type(C,peVar5,*(expression **)(lVar4 + 0x18),enumcase);
    }
    return (symbol *)0x0;
  case STMT_ITERATOR:
    dmrC_evaluate_symbol_list(C,(stmt->field_2).field_8.iterator_syms);
    evaluate_conditional(C,(stmt->field_2).field_8.iterator_pre_condition,1);
    evaluate_conditional(C,(stmt->field_2).field_8.iterator_post_condition,1);
    dmrC_evaluate_statement(C,(stmt->field_2).field_4.args);
    dmrC_evaluate_statement(C,(stmt->field_2).field_8.iterator_statement);
    lVar4 = 0x40;
    goto LAB_0010d99f;
  default:
    goto switchD_0010d90e_caseD_9;
  case STMT_GOTO:
    psVar3 = (stmt->field_2).field_4.stmts;
    if ((psVar3 != (statement_list *)0x0) && (psVar3->list_[0xe] == (statement *)0x0)) {
      ident = psVar3->allocator_;
      if ((ident->size_ & 0x400) != 0) {
        psVar6 = dmrC_lookup_symbol((ident *)ident,NS_KEYWORD);
        if (psVar6 != (symbol *)0x0) goto LAB_0010dd96;
        ident = psVar3->allocator_;
      }
      pcVar7 = dmrC_show_ident(C,(ident *)ident);
      dmrC_sparse_error(C,stmt->pos,"label \'%s\' was not declared",pcVar7);
    }
LAB_0010dd96:
    peVar5 = (stmt->field_2).field_1.context;
    break;
  case STMT_ASM:
    peVar5 = (stmt->field_2).field_1.expression;
    if ((peVar5 != (expression *)0x0) && (*(char *)peVar5 == '\x02')) {
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_50,(ptr_list *)(stmt->field_2).field_1.context);
      peVar5 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
      if (peVar5 != (expression *)0x0) {
        iVar9 = 0;
        do {
          if (iVar9 == 0) {
            iVar9 = 1;
          }
          else if (iVar9 == 2) {
            psVar6 = dmrC_evaluate_expression(C,peVar5);
            if (psVar6 == (symbol *)0x0) {
              return (symbol *)0x0;
            }
            if ((*(char *)peVar5 != '\t') || (peVar5->op != 0x2a)) {
              dmrC_warning(C,peVar5->pos,"asm output is not an lvalue");
            }
            evaluate_assign_to(C,peVar5,(symbol *)(peVar5->ctype->field_14).field_2.ctype.modifiers)
            ;
            iVar9 = 0;
          }
          else if (*(char *)peVar5 == '\x02') {
            piVar2 = (peVar5->field_5).field_4.symbol_name;
            cVar1 = *(char *)((long)&piVar2->next + 4);
            iVar9 = 2;
            if ((cVar1 != '+') && (cVar1 != '=')) {
              dmrC_expression_error
                        (C,peVar5,"output constraint is not an assignment constraint (\"%s\")",
                         (undefined1 *)((long)&piVar2->next + 4));
            }
          }
          else {
            dmrC_sparse_error(C,peVar5->pos,"asm output constraint is not a string");
            (siter__.__head)->list_[(int)siter__.__list] = (void *)0x0;
            iVar9 = 2;
          }
          peVar5 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
        } while (peVar5 != (expression *)0x0);
      }
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_50,(ptr_list *)(stmt->field_2).field_3.if_false);
      peVar5 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
      if (peVar5 != (expression *)0x0) {
        iVar9 = 0;
        do {
          if (iVar9 == 0) {
            iVar9 = 1;
          }
          else if (iVar9 == 2) {
            psVar6 = dmrC_evaluate_expression(C,peVar5);
            iVar9 = 0;
            if (psVar6 == (symbol *)0x0) {
              return (symbol *)0x0;
            }
          }
          else if (*(char *)peVar5 == '\x02') {
            piVar2 = (peVar5->field_5).field_4.symbol_name;
            cVar1 = *(char *)((long)&piVar2->next + 4);
            iVar9 = 2;
            if ((cVar1 == '=') || (cVar1 == '+')) {
              dmrC_expression_error
                        (C,peVar5,"input constraint with assignment (\"%s\")",
                         (undefined1 *)((long)&piVar2->next + 4));
            }
          }
          else {
            dmrC_sparse_error(C,peVar5->pos,"asm input constraint is not a string");
            (siter__.__head)->list_[(int)siter__.__list] = (void *)0x0;
            iVar9 = 2;
          }
          peVar5 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
        } while (peVar5 != (expression *)0x0);
      }
      ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(stmt->field_2).field_4.args);
      peVar5 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
      while (peVar5 != (expression *)0x0) {
        if (*(char *)peVar5 != '\x02') {
          dmrC_expression_error(C,peVar5,"asm clobber is not a string");
        }
        peVar5 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_50);
      }
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_50,
                 (ptr_list *)(stmt->field_2).field_8.iterator_pre_condition);
      do {
        pcVar7 = (char *)ptrlist_iter_next((ptr_list_iter *)local_50);
        if (pcVar7 == (char *)0x0) {
          return (symbol *)0x0;
        }
      } while (*pcVar7 == '\x0e');
      dmrC_sparse_error(C,stmt->pos,"bad asm label");
      return (symbol *)0x0;
    }
    pos = stmt->pos;
    pcVar7 = "need constant string for inline asm";
LAB_0010de72:
    dmrC_sparse_error(C,pos,pcVar7);
    psVar6 = (symbol *)0x0;
    goto switchD_0010d90e_caseD_9;
  case STMT_CONTEXT:
    peVar5 = (stmt->field_2).field_1.expression;
    break;
  case STMT_RANGE:
    dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
    dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
    peVar5 = (stmt->field_2).field_11.range_high;
  }
  dmrC_evaluate_expression(C,peVar5);
  return (symbol *)0x0;
code_r0x0010d8ee:
  stmt = (stmt->field_2).field_3.if_true;
  if (stmt == (statement *)0x0) goto switchD_0010d90e_caseD_9;
  goto LAB_0010d8e6;
}

Assistant:

struct symbol *dmrC_evaluate_statement(struct dmr_C *C, struct statement *stmt)
{
	if (!stmt)
		return NULL;

	switch (stmt->type) {
	case STMT_DECLARATION: {
		struct symbol *s;
		FOR_EACH_PTR(stmt->declaration, s) {
			evaluate_symbol(C, s);
		} END_FOR_EACH_PTR(s);
		return NULL;
	}

	case STMT_RETURN:
		return evaluate_return_expression(C, stmt);

	case STMT_EXPRESSION:
		if (!dmrC_evaluate_expression(C, stmt->expression))
			return NULL;
		if (stmt->expression->ctype == &C->S->null_ctype)
			stmt->expression = cast_to(C, stmt->expression, &C->S->ptr_ctype);
		return degenerate(C, stmt->expression);

	case STMT_COMPOUND: {
		struct statement *s;
		struct symbol *type = NULL;

		/* Evaluate the return symbol in the compound statement */
		evaluate_symbol(C, stmt->ret);

		/*
		 * Then, evaluate each statement, making the type of the
		 * compound statement be the type of the last statement
		 */
		type = dmrC_evaluate_statement(C, stmt->args);
		FOR_EACH_PTR(stmt->stmts, s) {
			type = dmrC_evaluate_statement(C, s);
		} END_FOR_EACH_PTR(s);
		if (!type)
			type = &C->S->void_ctype;
		return type;
	}
	case STMT_IF:
		evaluate_if_statement(C, stmt);
		return NULL;
	case STMT_ITERATOR:
		evaluate_iterator(C, stmt);
		return NULL;
	case STMT_SWITCH:
		evaluate_switch_statement(C, stmt);
		return NULL;
	case STMT_CASE:
		evaluate_case_statement(C, stmt);
		return NULL;
	case STMT_LABEL:
		return dmrC_evaluate_statement(C, stmt->label_statement);
	case STMT_GOTO:
		evaluate_goto_statement(C, stmt);
		return NULL;
	case STMT_NONE:
		break;
	case STMT_ASM:
		evaluate_asm_statement(C, stmt);
		return NULL;
	case STMT_CONTEXT:
		dmrC_evaluate_expression(C, stmt->expression);
		return NULL;
	case STMT_RANGE:
		dmrC_evaluate_expression(C, stmt->range_expression);
		dmrC_evaluate_expression(C, stmt->range_low);
		dmrC_evaluate_expression(C, stmt->range_high);
		return NULL;
	}
	return NULL;
}